

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O2

Result * CoreML::validateNdMultiArrayInputType
                   (Result *__return_storage_ptr__,ArrayFeatureType *arrayType)

{
  int iVar1;
  allocator<char> local_29;
  string local_28;
  
  iVar1 = (arrayType->shape_).current_size_;
  if (iVar1 < 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,
               "Input MLMultiArray to neural networks must have at least 1 dimension.",&local_29);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_28);
  }
  else {
    if ((arrayType->_oneof_case_[0] != 0x1f) ||
       ((((arrayType->ShapeFlexibility_).enumeratedshapes_)->shapes_).super_RepeatedPtrFieldBase.
        current_size_ == iVar1)) {
      Result::Result(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,
               "For MLMultiArray input: Rank of the flexible shape range must match the rank of the default shape."
               ,&local_29);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_28);
  }
  std::__cxx11::string::~string((string *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateNdMultiArrayInputType(const Specification::ArrayFeatureType& arrayType)
{
    auto rank = arrayType.shape().size();
    if (!(rank > 0)) {
        return Result(ResultType::INVALID_MODEL_INTERFACE, "Input MLMultiArray to neural networks must have at least 1 dimension.");
    }
    switch (arrayType.ShapeFlexibility_case()) {
        case CoreML::Specification::ArrayFeatureType::kEnumeratedShapes:
            break;
        case CoreML::Specification::ArrayFeatureType::kShapeRange:
            if (arrayType.shaperange().sizeranges_size() != rank) {
                return Result(ResultType::INVALID_MODEL_INTERFACE, "For MLMultiArray input: Rank of the flexible shape range must match the rank of the default shape.");
                break;
            }
        case CoreML::Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
            break;
    }

    return Result();
}